

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::dosummaryprocessing(summarycalc *this,int samplesize)

{
  pointer piVar1;
  uint uVar2;
  int event_id;
  int item_id;
  OASIS_FLOAT **ppOVar3;
  size_t sVar4;
  int coverage_or_output_id;
  int i;
  long lVar5;
  sampleslevelRec sr;
  fmlevelhdr fh;
  OASIS_FLOAT local_48;
  int local_44;
  OASIS_FLOAT local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  lVar5 = 0;
  do {
    if (this->fout[lVar5] != (FILE *)0x0) {
      ppOVar3 = alloc_ssl_arrays(this,(int)lVar5,samplesize);
      this->sssl[lVar5] = ppOVar3;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  lVar5 = 0;
  do {
    if (this->fout[lVar5] != (FILE *)0x0) {
      reset_ssl_array(this,(int)lVar5,samplesize,this->sssl[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  alloc_sse_array(this);
  reset_sse_array(this);
  lVar5 = 0;
  do {
    if (this->fout[lVar5] != (FILE *)0x0) {
      outputsamplesizeandsummaryset(this,(int)lVar5,samplesize);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  sVar4 = fread(&local_3c,8,1,_stdin);
  if ((int)sVar4 == 1) {
    local_34 = 0;
    do {
      item_id = local_38;
      piVar1 = (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      coverage_or_output_id = local_38;
      if ((this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        coverage_or_output_id = piVar1[local_38];
      }
      uVar2 = local_34 & 1;
      local_34 = local_34 & 0xff;
      if (uVar2 == 0) {
        local_34 = 1;
      }
      sVar4 = fread(&local_44,8,1,_stdin);
      event_id = local_3c;
      if ((int)sVar4 != 0) {
        local_48 = 0.0;
        do {
          switch(local_44) {
          case 0:
            goto switchD_001043de_caseD_0;
          case -5:
            dosummary_maxloss(this,samplesize,event_id,coverage_or_output_id,-5,local_40);
            break;
          case -4:
            break;
          case -3:
            local_48 = local_40;
            break;
          default:
            dosummary(this,samplesize,event_id,item_id,coverage_or_output_id,local_44,local_40,
                      local_48);
          }
          sVar4 = fread(&local_44,8,1,_stdin);
        } while ((int)sVar4 != 0);
      }
switchD_001043de_caseD_0:
      sVar4 = fread(&local_3c,8,1,_stdin);
    } while ((int)sVar4 == 1);
    if ((local_34 & 1) != 0) {
      lVar5 = 0;
      do {
        if (this->fout[lVar5] != (FILE *)0x0) {
          outputsummaryset(this,samplesize,(int)lVar5,local_3c);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
    }
  }
  return;
}

Assistant:

void summarycalc::dosummaryprocessing(int samplesize)
{
	alloc_sssl_array(samplesize);
	reset_sssl_array(samplesize);
	alloc_sse_array();
	reset_sse_array();
	outputsamplesize(samplesize);
	fmlevelhdr fh;	
	bool havedata = false;
	int i = 1;
	while ((i = (int)fread(&fh, sizeof(fh), 1, stdin)) == 1) {
		OASIS_FLOAT expure_val = 0;
		int cov_id = getcovid(fh.output_id);
		if (i > 0 && havedata == false) havedata = true;
		while (i != 0) {
			sampleslevelRec sr;
			i = (int)fread(&sr, sizeof(sr), 1, stdin);
			if (i == 0) break;
			if (sr.sidx == 0) break;
			if (sr.sidx == number_of_affected_risk_idx) continue;
			if (sr.sidx == tiv_idx) {
				expure_val = sr.loss;
			} else if (sr.sidx == max_loss_idx) {
				dosummary_maxloss(samplesize, fh.event_id,
						  cov_id, sr.sidx, sr.loss);
			} else {
				dosummary(samplesize, fh.event_id, fh.output_id,
					  cov_id, sr.sidx, sr.loss, expure_val);
			}
		}
	}
	if (havedata) outputsummary(samplesize, fh.event_id);
}